

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

void __thiscall zsummer::log4z::CLogerManager::GetExampleConfig_abi_cxx11_(CLogerManager *this)

{
  long in_RSI;
  
  GetExampleConfig_abi_cxx11_((string *)this,(CLogerManager *)(in_RSI + -0x10));
  return;
}

Assistant:

std::string GetExampleConfig()
	{
		return ""
			"[FileConfig]\n"
			"#path=./log/\n"
			"#level=DEBUG\n"
			"#display=true\n"
			"#monthdir=false\n"
			"#limit=100\n";
	}